

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O3

void __thiscall TadsServerThread::thread_main(TadsServerThread *this)

{
  OS_Counter *pOVar1;
  TadsListenerThread *pTVar2;
  int iVar3;
  
  pTVar2 = this->listener;
  pthread_mutex_lock((pthread_mutex_t *)&pTVar2->mutex->h);
  this->next_server = pTVar2->servers;
  pTVar2->servers = this;
  LOCK();
  pOVar1 = &(this->super_OS_Thread).super_CVmWeakRefable.super_CVmRefCntObj.cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + 1;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)&pTVar2->mutex->h);
  do {
    iVar3 = OS_Waitable::test(&this->listener->quit_evt->super_OS_Waitable);
    if (iVar3 != 0) break;
    iVar3 = OS_Waitable::test(&this->listener->shutdown_evt->super_OS_Waitable);
    if (iVar3 != 0) break;
    iVar3 = (*(this->super_OS_Thread).super_CVmWeakRefable.super_CVmRefCntObj._vptr_CVmRefCntObj[4])
                      (this);
  } while (iVar3 != 0);
  iVar3 = 0x2c87d5;
  set_run_state(this,"Closing");
  OS_CoreSocket::close(&this->socket->super_OS_CoreSocket,iVar3);
  TadsListenerThread::remove_thread(this->listener,this);
  set_run_state(this,"Terminated");
  return;
}

Assistant:

void TadsServerThread::thread_main()
{
    /* add this thread to the listener's active server list */
    listener->add_thread(this);

    /* process requests until we encounter an error or Quit signal */
    while (!listener->quit_evt->test()
           && !listener->shutdown_evt->test()
           && process_request()) ;

    /* terminating - close the socket */
    set_run_state("Closing");
    socket->close();

    /* remove myself from the listener's active server list */
    listener->remove_thread(this);

    /* set my final run state */
    set_run_state("Terminated");
}